

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O2

bool __thiscall
sparse_square_matrix<bool>::get(sparse_square_matrix<bool> *this,uint32_t i,uint32_t j)

{
  uint uVar1;
  const_reference cVar2;
  undefined1 uVar3;
  const_iterator cVar4;
  char *__assertion;
  ulong local_10;
  
  uVar1 = this->N;
  if (i < uVar1) {
    if (j < uVar1) {
      if (((this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
           (this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
         ((this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
        local_10 = (ulong)(uVar1 * i + j);
        cVar4 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_bool>,_std::allocator<std::pair<const_unsigned_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->sparseStorage)._M_h,&local_10);
        if (cVar4.super__Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false>._M_cur ==
            (__node_type *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = *(undefined1 *)
                   ((long)cVar4.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_bool>,_false>.
                          _M_cur + 0x10);
        }
        return (bool)uVar3;
      }
      cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->denseStorage,(ulong)(uVar1 * i + j));
      return cVar2;
    }
    __assertion = "j < N";
    uVar1 = 0x3a;
  }
  else {
    __assertion = "i < N";
    uVar1 = 0x39;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/sparse_square_matrix.h"
                ,uVar1,
                "const Ty sparse_square_matrix<bool>::get(uint32_t, uint32_t) const [Ty = bool]");
}

Assistant:

const Ty get(uint32_t i, uint32_t j) const {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      return denseStorage[i * N + j];
    }
    auto iter = sparseStorage.find(i * N + j);
    return iter == sparseStorage.end() ? Ty() : iter->second;
  }